

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-doc.c
# Opt level: O2

int fy_node_set_vanchorf(fy_node *fyn,char *fmt,__va_list_tag *ap)

{
  fy_document *fyd;
  size_t len;
  undefined8 uVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  char *pcVar6;
  char *__s;
  char *text;
  undefined8 uStack_60;
  undefined8 uStack_58;
  va_list _ap_orig;
  
  __s = (char *)&uStack_58;
  if (fmt == (char *)0x0 || fyn == (fy_node *)0x0) {
    iVar3 = -1;
  }
  else {
    fyd = fyn->fyd;
    _ap_orig[0].overflow_arg_area = ap->reg_save_area;
    uStack_58._0_4_ = ap->gp_offset;
    uStack_58._4_4_ = ap->fp_offset;
    _ap_orig[0]._0_8_ = ap->overflow_arg_area;
    uStack_60 = 0x11b8b1;
    iVar3 = vsnprintf((char *)0x0,0,fmt,&uStack_58);
    text = (char *)0x0;
    if (iVar3 != -1) {
      lVar2 = -((long)iVar3 + 0x10U & 0xfffffffffffffff0);
      __s = (char *)((long)_ap_orig + lVar2 + -8);
      *(undefined8 *)((long)&uStack_60 + lVar2) = 0x11b8de;
      iVar4 = vsnprintf(__s,(long)iVar3 + 1,fmt,ap);
      if (iVar3 != iVar4) {
        *(code **)((long)&uStack_60 + lVar2) = fy_node_set_anchorf;
        __assert_fail("_size == _sizew",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-doc.c"
                      ,0x10b,
                      "int fy_node_set_vanchorf(struct fy_node *, const char *, struct __va_list_tag *)"
                     );
      }
      *(undefined8 *)((long)&uStack_60 + lVar2) = 0x11b8eb;
      sVar5 = strlen(__s);
      pcVar6 = __s + sVar5;
      while ((text = __s, __s < pcVar6 && (pcVar6[-1] == '\n'))) {
        pcVar6 = pcVar6 + -1;
        *pcVar6 = '\0';
      }
    }
    __s[-8] = -1;
    __s[-7] = -1;
    __s[-6] = -1;
    __s[-5] = -1;
    __s[-4] = -1;
    __s[-3] = -1;
    __s[-2] = -1;
    __s[-1] = -1;
    len = *(size_t *)(__s + -8);
    __s[-8] = '\x01';
    __s[-7] = '\0';
    __s[-6] = '\0';
    __s[-5] = '\0';
    __s[-4] = '\0';
    __s[-3] = '\0';
    __s[-2] = '\0';
    __s[-1] = '\0';
    uVar1 = *(undefined8 *)(__s + -8);
    __s[-8] = '\x1c';
    __s[-7] = -0x47;
    __s[-6] = '\x11';
    __s[-5] = '\0';
    __s[-4] = '\0';
    __s[-3] = '\0';
    __s[-2] = '\0';
    __s[-1] = '\0';
    iVar3 = fy_document_set_anchor_internal(fyd,fyn,text,len,(uint)uVar1);
  }
  return iVar3;
}

Assistant:

int fy_node_set_vanchorf(struct fy_node *fyn, const char *fmt, va_list ap) {
    if (!fyn || !fmt)
        return -1;

    return fy_document_set_anchor_internal(fyn->fyd, fyn, alloca_vsprintf(fmt, ap), FY_NT, FYDSAF_COPY);
}